

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

Option * __thiscall
CLI::App::set_help_all_flag(App *this,string *help_name,string *help_description)

{
  ulong uVar1;
  Option *pOVar2;
  string local_40;
  string *local_20;
  string *help_description_local;
  string *help_name_local;
  App *this_local;
  
  local_20 = help_description;
  help_description_local = help_name;
  help_name_local = (string *)this;
  if (this->help_all_ptr_ != (Option *)0x0) {
    remove_option(this,this->help_all_ptr_);
    this->help_all_ptr_ = (Option *)0x0;
  }
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::string((string *)&local_40,(string *)help_name);
    pOVar2 = add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                       (this,&local_40,local_20);
    this->help_all_ptr_ = pOVar2;
    ::std::__cxx11::string::~string((string *)&local_40);
    OptionBase<CLI::Option>::configurable(&this->help_all_ptr_->super_OptionBase<CLI::Option>,false)
    ;
  }
  return this->help_all_ptr_;
}

Assistant:

CLI11_INLINE Option *App::set_help_all_flag(std::string help_name, const std::string &help_description) {
    // take flag_description by const reference otherwise add_flag tries to assign to flag_description
    if(help_all_ptr_ != nullptr) {
        remove_option(help_all_ptr_);
        help_all_ptr_ = nullptr;
    }

    // Empty name will simply remove the help all flag
    if(!help_name.empty()) {
        help_all_ptr_ = add_flag(help_name, help_description);
        help_all_ptr_->configurable(false);
    }

    return help_all_ptr_;
}